

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerset.h
# Opt level: O0

bool __thiscall
wasm::analysis::
FinitePowersetLattice<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::join(FinitePowersetLattice<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,Element *joinee,Element *joiner)

{
  bool bVar1;
  Element *joiner_local;
  Element *joinee_local;
  FinitePowersetLattice<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  bVar1 = FiniteIntPowersetLattice::join(&this->intLattice,joinee,joiner);
  return bVar1;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    return intLattice.join(joinee, joiner);
  }